

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  double dVar2;
  pointer ppVar3;
  result_type rVar4;
  const_reference pdVar5;
  reference pdVar6;
  reference pvVar7;
  ostream *poVar8;
  ulong uVar9;
  int iVar10;
  boundary_t *bdry_00;
  boundary_t *bdry_01;
  boundary_t *bdry_02;
  size_t i_1;
  size_type sVar11;
  long lVar12;
  pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long> *i_9;
  pointer ppVar13;
  size_t i;
  unsigned_long uVar14;
  long lVar15;
  pointer ppVar16;
  bool bVar17;
  allocator local_167a;
  allocator local_1679;
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  vals;
  aabb_t q;
  point_t l;
  point_t u;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1608;
  point<double,_2UL> retval_1;
  vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  boxes;
  string local_15a8;
  uniform_int_distribution<unsigned_long> uni;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1578;
  rtree_t tree;
  query_intersects_box<perior::point<double,_2UL>_> local_1418;
  boundary_t bdry;
  mt19937 mt_;
  
  mt_._M_x[0] = 0;
  mt_._M_x[1] = 0;
  tree.root_ = 0x408f400000000000;
  tree._8_8_ = 0x408f400000000000;
  perior::cubic_periodic_boundary<perior::point<double,_2UL>_>::cubic_periodic_boundary
            (&bdry,(point_type *)&mt_,(point_type *)&tree);
  tree.root_ = 0xffffffffffffffff;
  tree.boundary_.lower_.values_.elems[0] = bdry.lower_.values_.elems[0];
  tree.boundary_.lower_.values_.elems[1] = bdry.lower_.values_.elems[1];
  tree.boundary_.upper_.values_.elems[0] = bdry.upper_.values_.elems[0];
  tree.boundary_.upper_.values_.elems[1] = bdry.upper_.values_.elems[1];
  tree.boundary_.width_.values_.elems[0]._0_4_ = bdry.width_.values_.elems[0]._0_4_;
  tree.boundary_.width_.values_.elems[0]._4_4_ = bdry.width_.values_.elems[0]._4_4_;
  tree.boundary_.width_.values_.elems[1]._0_4_ = bdry.width_.values_.elems[1]._0_4_;
  tree.boundary_.width_.values_.elems[1]._4_4_ = bdry.width_.values_.elems[1]._4_4_;
  tree.boundary_.half_width_.values_.elems[0] = bdry.half_width_.values_.elems[0];
  tree.boundary_.half_width_.values_.elems[1] = bdry.half_width_.values_.elems[1];
  tree.overwritable_values_.
  super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
  m_start = (pointer)&tree.overwritable_values_.
                      super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.
                      m_storage_start;
  tree.tree_.m_holder.m_start = (pointer)0x0;
  tree.tree_.m_holder.m_size = 0;
  tree.tree_.m_holder.m_capacity = 0;
  tree.container_.m_holder.m_start = (pointer)0x0;
  tree.container_.m_holder.m_size = 0;
  tree.container_.m_holder.m_capacity = 0;
  tree.overwritable_values_.
  super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
  m_size = 0;
  tree.overwritable_values_.
  super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
  m_capacity = 8;
  tree.overwritable_nodes_.
  super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
  m_start = (pointer)&tree.overwritable_nodes_.
                      super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.
                      m_storage_start;
  tree.overwritable_nodes_.
  super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
  m_size = 0;
  tree.overwritable_nodes_.
  super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
  m_capacity = 8;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt_,0x75bcd15);
  uni._M_param._M_a = 0;
  uni._M_param._M_b = 10000;
  boxes.
  super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  boxes.
  super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes.
  super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar14 = 0; uVar14 != 0x32; uVar14 = uVar14 + 1) {
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&uni,&mt_);
    iVar10 = (int)(rVar4 % 100) * 10;
    l.values_.elems[0] = (double)iVar10;
    l.values_.elems[1] = (double)((rVar4 / 100) * 10);
    u.values_.elems[0] = (double)(iVar10 + 10);
    u.values_.elems[1] = l.values_.elems[1] + 10.0;
    retval_1.values_.elems[0] = 0.0;
    retval_1.values_.elems[1] = 0.0;
    for (sVar11 = 0; sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&u.values_,sVar11);
      dVar1 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[](&l.values_,sVar11);
      dVar2 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      *pdVar6 = dVar1 + dVar2;
    }
    q.center.values_.elems[0] = 0.0;
    q.center.values_.elems[1] = 0.0;
    for (sVar11 = 0; sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&q,sVar11);
      *pdVar6 = dVar1 * 0.5;
    }
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)q.center.values_.elems[0];
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)q.center.values_.elems[1];
    retval_1.values_.elems[0] = 0.0;
    retval_1.values_.elems[1] = 0.0;
    for (sVar11 = 0; sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&u.values_,sVar11);
      dVar1 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[](&l.values_,sVar11);
      dVar2 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      *pdVar6 = dVar1 - dVar2;
    }
    q.center.values_.elems[0] = 0.0;
    q.center.values_.elems[1] = 0.0;
    for (sVar11 = 0; dVar1 = q.center.values_.elems[1], sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&q,sVar11);
      *pdVar6 = dVar1 * 0.5;
    }
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)q.center.values_.elems[0];
    std::
    vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
    ::push_back(&boxes,(value_type *)&vals);
    q.center.values_.elems[0] =
         (double)vals.
                 super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    q.center.values_.elems[1] =
         (double)vals.
                 super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    q.radius.values_.elems[0] =
         (double)vals.
                 super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    q.radius.values_.elems[1] = dVar1;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert(&tree,(value_type *)&q);
    std::__cxx11::string::string((string *)&local_1608,"rtree_",&local_1679);
    std::__cxx11::to_string(&local_15a8,uVar14);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval_1,
                   &local_1608,&local_15a8);
    std::__cxx11::string::string((string *)&local_1578,".svg",&local_167a);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval_1,
                   &local_1578);
    std::__cxx11::string::~string((string *)&local_1578);
    std::__cxx11::string::~string((string *)&retval_1);
    std::__cxx11::string::~string((string *)&local_15a8);
    std::__cxx11::string::~string((string *)&local_1608);
    dump((string *)&q,&tree,bdry_00);
    std::__cxx11::string::~string((string *)&q);
  }
  uVar14 = 0x32;
  lVar12 = 0x14;
  while (bVar17 = lVar12 != 0, lVar12 = lVar12 + -1, bVar17) {
    *(uint *)(std::out_of_range::~out_of_range + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::out_of_range::~out_of_range + *(long *)(std::cout + -0x18)) | 1;
    pvVar7 = std::
             vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
             ::at(&boxes,uVar14 - 0x32);
    q.center.values_.elems[0] = (pvVar7->center).values_.elems[0];
    q.center.values_.elems[1] = (pvVar7->center).values_.elems[1];
    q.radius.values_.elems[0] = (pvVar7->radius).values_.elems[0];
    q.radius.values_.elems[1] = (pvVar7->radius).values_.elems[1];
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::remove(&tree,(char *)&q);
    poVar8 = std::ostream::_M_insert<bool>(true);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::string((string *)&retval_1,"rtree_",(allocator *)&local_1578);
    std::__cxx11::to_string(&local_1608,uVar14);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vals,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval_1,
                   &local_1608);
    std::__cxx11::string::string((string *)&local_15a8,".svg",(allocator *)&l);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vals,
                   &local_15a8);
    std::__cxx11::string::~string((string *)&local_15a8);
    std::__cxx11::string::~string((string *)&vals);
    std::__cxx11::string::~string((string *)&local_1608);
    std::__cxx11::string::~string((string *)&retval_1);
    dump((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,&tree,bdry_01);
    std::__cxx11::string::~string((string *)&q);
    uVar14 = uVar14 + 1;
  }
  for (uVar14 = 0x46; uVar14 != 0x5a; uVar14 = uVar14 + 1) {
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&uni,&mt_);
    iVar10 = (int)(rVar4 % 100) * 10;
    l.values_.elems[0] = (double)iVar10;
    l.values_.elems[1] = (double)((rVar4 / 100) * 10);
    u.values_.elems[0] = (double)(iVar10 + 10);
    u.values_.elems[1] = l.values_.elems[1] + 10.0;
    retval_1.values_.elems[0] = 0.0;
    retval_1.values_.elems[1] = 0.0;
    for (sVar11 = 0; sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&u.values_,sVar11);
      dVar1 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[](&l.values_,sVar11);
      dVar2 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      *pdVar6 = dVar1 + dVar2;
    }
    q.center.values_.elems[0] = 0.0;
    q.center.values_.elems[1] = 0.0;
    for (sVar11 = 0; sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&q,sVar11);
      *pdVar6 = dVar1 * 0.5;
    }
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)q.center.values_.elems[0];
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)q.center.values_.elems[1];
    retval_1.values_.elems[0] = 0.0;
    retval_1.values_.elems[1] = 0.0;
    for (sVar11 = 0; sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&u.values_,sVar11);
      dVar1 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[](&l.values_,sVar11);
      dVar2 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      *pdVar6 = dVar1 - dVar2;
    }
    q.center.values_.elems[0] = 0.0;
    q.center.values_.elems[1] = 0.0;
    for (sVar11 = 0; dVar1 = q.center.values_.elems[1], sVar11 != 2; sVar11 = sVar11 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&retval_1,sVar11);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&q,sVar11);
      *pdVar6 = dVar1 * 0.5;
    }
    vals.
    super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)q.center.values_.elems[0];
    std::
    vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
    ::push_back(&boxes,(value_type *)&vals);
    q.center.values_.elems[0] =
         (double)vals.
                 super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    q.center.values_.elems[1] =
         (double)vals.
                 super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    q.radius.values_.elems[0] =
         (double)vals.
                 super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    q.radius.values_.elems[1] = dVar1;
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert(&tree,(value_type *)&q);
    std::__cxx11::string::string((string *)&local_1608,"rtree_",&local_1679);
    std::__cxx11::to_string(&local_15a8,uVar14);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval_1,
                   &local_1608,&local_15a8);
    std::__cxx11::string::string((string *)&local_1578,".svg",&local_167a);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retval_1,
                   &local_1578);
    std::__cxx11::string::~string((string *)&local_1578);
    std::__cxx11::string::~string((string *)&retval_1);
    std::__cxx11::string::~string((string *)&local_15a8);
    std::__cxx11::string::~string((string *)&local_1608);
    dump((string *)&q,&tree,bdry_02);
    std::__cxx11::string::~string((string *)&q);
  }
  q.center.values_.elems[0] =
       boxes.
       super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].center.values_.elems[0];
  q.center.values_.elems[1] =
       boxes.
       super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].center.values_.elems[1];
  q.radius.values_.elems[0] =
       boxes.
       super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].radius.values_.elems[0];
  q.radius.values_.elems[1] =
       boxes.
       super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].radius.values_.elems[1];
  vals.
  super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vals.
  super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vals.
  super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1418.rect.center.values_.elems[0] = q.center.values_.elems[0];
  local_1418.rect.center.values_.elems[1] = q.center.values_.elems[1];
  local_1418.rect.radius.values_.elems[0] = q.radius.values_.elems[0];
  local_1418.rect.radius.values_.elems[1] = q.radius.values_.elems[1];
  perior::
  rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
  ::
  query<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
            ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
              *)&tree,&local_1418,&vals);
  ppVar13 = vals.
            super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = vals.
           super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (vals.
      super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vals.
      super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar15 = (long)vals.
                   super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)vals.
                   super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = lVar15 / 0x28;
    lVar12 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
              (vals.
               super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               vals.
               super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (ppVar3,ppVar13);
    }
    else {
      ppVar16 = ppVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (ppVar3,ppVar16);
      for (; ppVar16 != ppVar13; ppVar16 = ppVar16 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                  (ppVar16);
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"queried values = { ");
  ppVar3 = vals.
           super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar13 = vals.
                 super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar3; ppVar13 = ppVar13 + 1
      ) {
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar8,' ');
  }
  poVar8 = std::operator<<((ostream *)&std::cout,'}');
  std::endl<char,std::char_traits<char>>(poVar8);
  std::
  _Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ::~_Vector_base(&vals.
                   super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                 );
  std::
  _Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  ::~_Vector_base(&boxes.
                   super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
                 );
  perior::
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ::~rtree(&tree);
  return 0;
}

Assistant:

int main()
{
    boundary_t bdry(point_t{0,0}, point_t{1000, 1000});
    rtree_t tree(bdry);

    std::mt19937 mt_(123456789);
    std::uniform_int_distribution<std::size_t> uni(0, 10000);

    std::vector<aabb_t> boxes;
    for(std::size_t i=0; i<50; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));

        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);

    }

    for(std::size_t i=50; i<70; ++i)
    {
        const std::size_t idx = i - 50;
        std::cout << std::boolalpha << tree.remove(value_t(boxes.at(idx), idx)) << std::endl;
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    for(std::size_t i=70; i<90; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    aabb_t q(boxes.back());
    std::vector<value_t> vals;
    tree.query(perior::query::intersects_box(q), std::back_inserter(vals));

    std::sort(vals.begin(), vals.end(), [](const value_t& lhs, const value_t rhs){return lhs.second < rhs.second;});

    std::cout << "queried values = { ";
    for(auto const& i : vals)
        std::cout << i.second << ' ';
    std::cout << '}' << std::endl;

    return 0;
}